

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::copyDirectory
          (Impl *this,Directory *other,bool copyFiles)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  String *pSVar6;
  Fault FVar7;
  Exception *pEVar8;
  long lVar9;
  InMemoryFileFactory *pIVar10;
  undefined8 uVar11;
  Type in_ECX;
  Type code;
  Exception *pEVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int iVar13;
  undefined7 in_register_00000011;
  long *plVar14;
  Directory *ptrCopy;
  Exception *pEVar15;
  File *ptrCopy_1;
  char *in_R8;
  code *in_R9;
  Path *this_00;
  size_t *name;
  long lVar16;
  Disposer *disposerCopy;
  bool bVar17;
  Own<const_kj::Directory,_std::nullptr_t> OVar18;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var19;
  Own<const_kj::File,_std::nullptr_t> copy;
  Path filename;
  EntryImpl entry;
  DebugExpression<bool> _kjCondition_1;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  newNode;
  DebugComparison<kj::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_&,_std::nullptr_t>
  *in_stack_fffffffffffffe68;
  undefined1 local_188 [16];
  char *pcStack_178;
  undefined8 uStack_170;
  bool bStack_168;
  undefined7 uStack_167;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_160;
  Path local_138;
  InMemoryFileFactory *local_118;
  Type local_10c;
  Fault local_108;
  Exception *pEStack_100;
  Exception *pEStack_f8;
  Exception *pEStack_f0;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_2
  local_e8;
  Exception *local_c8;
  long local_c0;
  Exception *pEStack_b8;
  Exception *pEStack_b0;
  Clock *local_a8;
  long *local_a0;
  long local_98;
  long lStack_90;
  undefined8 *local_88;
  Mutex *local_80;
  Impl *local_78;
  Exception *local_70;
  InMemoryFileFactory *local_68;
  InMemoryFileFactory *local_60;
  uint local_58;
  
  plVar14 = (long *)CONCAT71(in_register_00000011,copyFiles);
  pp_Var1 = (other->super_ReadableDirectory).super_FsNode._vptr_FsNode;
  pp_Var2 = other[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
  local_10c = in_ECX;
  local_78 = this;
  pIVar10 = (InMemoryFileFactory *)operator_new(0x78);
  local_a8 = (Clock *)(pIVar10 + 8);
  *(undefined4 *)(pIVar10 + 0x10) = 0;
  *(undefined ***)pIVar10 = &PTR_getFd_0070fe10;
  *(undefined **)(pIVar10 + 8) = &DAT_0070fee8;
  local_118 = pIVar10;
  kj::_::Mutex::Mutex((Mutex *)(pIVar10 + 0x18));
  *(_func_int ***)(pIVar10 + 0x30) = pp_Var1;
  *(_func_int ***)(pIVar10 + 0x38) = pp_Var2;
  *(undefined4 *)(pIVar10 + 0x48) = 0;
  *(undefined8 *)(pIVar10 + 0x50) = 0;
  *(InMemoryFileFactory **)(pIVar10 + 0x58) = pIVar10 + 0x48;
  *(InMemoryFileFactory **)(pIVar10 + 0x60) = pIVar10 + 0x48;
  *(undefined8 *)(pIVar10 + 0x68) = 0;
  local_80 = (Mutex *)(pIVar10 + 0x18);
  uVar11 = (**(code **)*pp_Var1)(pp_Var1);
  *(undefined8 *)(pIVar10 + 0x70) = uVar11;
  (**(code **)(*plVar14 + 0x38))(&local_98,plVar14);
  if (lStack_90 != 0) {
    local_68 = local_118 + 0x30;
    local_60 = local_118 + 0x40;
    name = (size_t *)(local_98 + 8);
    lVar16 = lStack_90 << 5;
    local_a0 = plVar14;
    do {
      this_00 = &local_138;
      Path::Path(this_00,(String *)name);
      local_58 = 0;
      iVar13 = *(int *)(name + -1);
      if (iVar13 == 0) {
        in_R8 = (char *)0x2;
        pEVar12 = (Exception *)local_138.parts.size_;
        (**(code **)(*plVar14 + 0x68))((Impl *)local_188,plVar14,local_138.parts.ptr);
        pEVar15 = (Exception *)local_188._8_8_;
        uVar11 = local_188._0_8_;
        code = (Type)pEVar12;
        plVar14 = local_a0;
        iVar13 = extraout_EDX_04;
        if ((Exception *)local_188._8_8_ != (Exception *)0x0) {
          pEVar12 = (Exception *)local_188._0_8_;
          if ((undefined1)local_10c != '\0') {
            (**(code **)**(undefined8 **)(local_118 + 0x38))
                      ((Impl *)local_188,*(undefined8 **)(local_118 + 0x38),
                       *(undefined8 *)(local_118 + 0x30));
            code = FAILED;
            in_R8 = (char *)0xffffffffffffffff;
            (**(code **)(*(long *)local_188._8_8_ + 0x68))(local_188._8_8_,0,pEVar15);
            uVar3 = local_188._8_8_;
            pEVar12 = (Exception *)local_188._0_8_;
            local_188._8_8_ = (InMemoryFileFactory *)0x0;
            (**(code **)(((String *)uVar11)->content).ptr)
                      (uVar11,(Clock *)(*(long *)(*(long *)pEVar15 + -0x10) + (long)pEVar15));
            uVar11 = local_188._8_8_;
            bVar17 = (InMemoryFileFactory *)local_188._8_8_ != (InMemoryFileFactory *)0x0;
            local_188._8_8_ = uVar3;
            if (bVar17) {
              local_188._8_8_ = (InMemoryFileFactory *)0x0;
              (**(code **)(((String *)local_188._0_8_)->content).ptr)
                        (local_188._0_8_,
                         (InMemoryFileFactory *)(uVar11 + *(long *)(*(long *)uVar11 + -0x10)));
              local_188._8_8_ = uVar3;
            }
          }
          local_188._0_4_ = 1;
          pcStack_178 = (char *)local_188._8_8_;
          local_188._8_8_ = pEVar12;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&stack0xffffffffffffffa8,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)local_188);
          plVar14 = local_a0;
          iVar13 = extraout_EDX_05;
        }
LAB_004ef027:
        if (pEVar15 != (Exception *)0x0) {
LAB_004ef032:
          local_188._0_8_ = &stack0xffffffffffffffa8;
          local_188._8_8_ = (InMemoryFileFactory *)0x0;
          pcStack_178 = " != ";
          uStack_170 = 5;
          bStack_168 = local_58 != 0;
          if (local_58 == 0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>&,decltype(nullptr)>&>
                      (&local_108,local_188,iVar13,code,in_R8,(char *)in_R9,
                       in_stack_fffffffffffffe68);
            kj::_::Debug::Fault::fatal(&local_108);
          }
          pEVar15 = (Exception *)((local_138.parts.ptr)->content).ptr;
          pEVar12 = (Exception *)((local_138.parts.ptr)->content).size_;
          pEStack_f8 = (Exception *)((local_138.parts.ptr)->content).disposer;
          ((local_138.parts.ptr)->content).ptr = (char *)0x0;
          ((local_138.parts.ptr)->content).size_ = 0;
          pEStack_f0 = (Exception *)((ulong)pEStack_f0 & 0xffffffff00000000);
          local_108.exception = pEVar15;
          pEStack_100 = pEVar12;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&pEStack_f0,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188._0_8_);
          local_188._8_8_ = (long)pEVar12->trace + ((ulong)(pEVar12 == (Exception *)0x0) - 0x68);
          if (pEVar12 == (Exception *)0x0) {
            pEVar15 = (Exception *)0x54bab9;
          }
          pcStack_178 = (char *)local_108.exception;
          uStack_170 = pEStack_100;
          _bStack_168 = pEStack_f8;
          local_108.exception = (Exception *)0x0;
          pEStack_100 = (Exception *)0x0;
          local_160.tag = (uint)pEStack_f0;
          if ((uint)pEStack_f0 == 3) {
            local_160.field_1._0_8_ = local_e8._0_8_;
            local_160.field_1._8_8_ = local_e8._8_8_;
            local_160.field_1._16_8_ = local_e8._16_8_;
            local_160.field_1._24_8_ = local_e8._24_8_;
            local_e8._8_8_ = 0;
            local_e8._16_8_ = 0;
          }
          else if (((uint)pEStack_f0 == 2) || ((uint)pEStack_f0 == 1)) {
            local_160.field_1._0_8_ = local_e8._0_8_;
            local_160.field_1._8_8_ = local_e8._8_8_;
            local_e8._8_8_ = 0;
          }
          local_188._0_8_ = pEVar15;
          _Var19 = std::
                   map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                   ::
                   insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                             ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                               *)local_60,
                              (pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                               *)local_188);
          local_c8 = (Exception *)CONCAT71(local_c8._1_7_,_Var19.second);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy(&local_160);
          uVar11 = uStack_170;
          pcVar5 = pcStack_178;
          if ((Exception *)pcStack_178 != (Exception *)0x0) {
            pcStack_178 = (char *)0x0;
            uStack_170 = (Exception *)0x0;
            in_R9 = (code *)0x0;
            (*(code *)**(undefined8 **)_bStack_168)(_bStack_168,pcVar5,1);
            in_R8 = (char *)uVar11;
          }
          if (local_c8._0_1_ == false) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_188,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x63c,FAILED,"entries.insert(std::make_pair(nameRef, kj::mv(entry))).second"
                       ,"_kjCondition,",(DebugExpression<bool> *)&local_c8);
            kj::_::Debug::Fault::fatal((Fault *)local_188);
          }
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)&pEStack_f0);
          pEVar15 = pEStack_100;
          FVar7.exception = local_108.exception;
          if (local_108.exception != (Exception *)0x0) {
            local_108.exception = (Exception *)0x0;
            pEStack_100 = (Exception *)0x0;
            in_R9 = (code *)0x0;
            (**(code **)(pEStack_f8->ownFile).content.ptr)(pEStack_f8,FVar7.exception,1);
            in_R8 = (char *)pEVar15;
          }
        }
      }
      else {
        if (iVar13 == 1) {
          in_R8 = (char *)0x2;
          pEVar12 = (Exception *)local_138.parts.size_;
          (**(code **)(*plVar14 + 0x88))((Impl *)local_188,plVar14,local_138.parts.ptr);
          pEVar15 = (Exception *)local_188._8_8_;
          uVar11 = local_188._0_8_;
          code = (Type)pEVar12;
          iVar13 = extraout_EDX_02;
          if ((Exception *)local_188._8_8_ != (Exception *)0x0) {
            code = local_10c & 0xff;
            OVar18 = copyDirectory((Impl *)local_188,(Directory *)local_68,SUB81(local_188._8_8_,0))
            ;
            uVar4 = local_188._8_8_;
            uVar3 = local_188._0_8_;
            local_188._8_8_ = (InMemoryFileFactory *)0x0;
            (**(code **)(((String *)uVar11)->content).ptr)
                      (uVar11,(Clock *)(*(long *)(*(long *)pEVar15 + -0x10) + (long)pEVar15),
                       OVar18.ptr);
            local_188._0_4_ = 2;
            local_188._8_8_ = uVar3;
            pcStack_178 = (char *)uVar4;
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                         *)&stack0xffffffffffffffa8,
                        (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                         *)local_188);
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
            plVar14 = local_a0;
            iVar13 = extraout_EDX_03;
          }
          goto LAB_004ef027;
        }
        if (iVar13 == 2) {
          (**(code **)(*plVar14 + 0x60))
                    ((Impl *)local_188,plVar14,local_138.parts.ptr,local_138.parts.size_);
          local_108.exception._0_1_ = local_188[0];
          if (local_188[0] != '\x01') goto LAB_004ef20a;
          pEStack_100 = (Exception *)local_188._8_8_;
          pEStack_f8 = (Exception *)pcStack_178;
          pEStack_f0 = (Exception *)uStack_170;
          local_188._8_8_ = (Exception *)0x0;
          pcStack_178 = (char *)0x0;
          (**(code **)(*plVar14 + 0x48))
                    ((Impl *)local_188,plVar14,local_138.parts.ptr,local_138.parts.size_);
          pEVar8 = pEStack_f0;
          pEVar12 = pEStack_f8;
          pEVar15 = pEStack_100;
          if (local_188[0] != '\0') {
            local_70 = (Exception *)_bStack_168;
          }
          if (local_188[0] != '\x01') {
            if (((char)local_108.exception == '\x01') && (pEStack_100 != (Exception *)0x0)) {
              pEStack_100 = (Exception *)0x0;
              pEStack_f8 = (Exception *)0x0;
              in_R9 = (code *)0x0;
              (**(code **)(pEStack_f0->ownFile).content.ptr)(pEStack_f0,pEVar15,1);
              in_R8 = (char *)pEVar12;
            }
            goto LAB_004ef20a;
          }
          local_c8 = local_70;
          pEStack_b0 = pEStack_f0;
          code = (Type)&pEStack_100;
          pEStack_100 = (Exception *)0x0;
          pEStack_f8 = (Exception *)0x0;
          local_188._0_4_ = 3;
          local_188._8_8_ = local_70;
          pcStack_178 = (char *)pEVar15;
          uStack_170 = pEVar12;
          _bStack_168 = pEStack_f0;
          local_c0 = 0;
          pEStack_b8 = (Exception *)0x0;
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::operator=((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&stack0xffffffffffffffa8,
                      (OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)local_188);
          OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                     *)local_188);
          pEVar15 = pEStack_b8;
          lVar9 = local_c0;
          iVar13 = extraout_EDX;
          if (local_c0 != 0) {
            local_c0 = 0;
            pEStack_b8 = (Exception *)0x0;
            in_R9 = (code *)0x0;
            in_R8 = (char *)pEVar15;
            (**(code **)(pEVar8->ownFile).content.ptr)(pEVar8,lVar9,1);
            code = (Type)pEVar15;
            iVar13 = extraout_EDX_00;
          }
          pEVar12 = pEStack_f8;
          pEVar15 = pEStack_100;
          if (((char)local_108.exception == '\x01') && (pEStack_100 != (Exception *)0x0)) {
            pEStack_100 = (Exception *)0x0;
            pEStack_f8 = (Exception *)0x0;
            in_R9 = (code *)0x0;
            in_R8 = (char *)pEVar12;
            (**(code **)(pEStack_f0->ownFile).content.ptr)(pEStack_f0,pEVar15,1);
            code = (Type)pEVar12;
            iVar13 = extraout_EDX_01;
          }
          goto LAB_004ef032;
        }
        if (kj::_::Debug::minSeverity < 3) {
          in_R8 = "couldn\'t copy node of type not supported by InMemoryDirectory";
          kj::_::Debug::log<char_const(&)[62],kj::Path&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x633,ERROR,
                     "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename",
                     (char (*) [62])"couldn\'t copy node of type not supported by InMemoryDirectory"
                     ,this_00);
          in_R9 = (code *)this_00;
        }
      }
LAB_004ef20a:
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)&stack0xffffffffffffffa8);
      pEVar15 = (Exception *)local_138.parts.size_;
      pSVar6 = local_138.parts.ptr;
      if (local_138.parts.ptr != (String *)0x0) {
        local_138.parts.ptr = (String *)0x0;
        local_138.parts.size_ = 0;
        in_R9 = ArrayDisposer::Dispose_<kj::String>::destruct;
        (**(local_138.parts.disposer)->_vptr_ArrayDisposer)(local_138.parts.disposer,pSVar6,0x18);
        in_R8 = (char *)pEVar15;
      }
      name = name + 4;
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0);
  }
  lVar9 = lStack_90;
  lVar16 = local_98;
  if (local_98 != 0) {
    local_98 = 0;
    lStack_90 = 0;
    (**(code **)*local_88)
              (local_88,lVar16,0x20,lVar9,lVar9,
               ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry>::destruct);
  }
  LOCK();
  *(int *)(local_118 + 0x10) = *(int *)(local_118 + 0x10) + 1;
  UNLOCK();
  local_78->clock = local_a8;
  local_78->fileFactory = local_118;
  OVar18.ptr = (Directory *)local_118;
  OVar18.disposer = (Disposer *)local_78;
  return OVar18;
}

Assistant:

Own<const Directory> copyDirectory(const Directory& other, bool copyFiles) const {
      // Creates an in-memory deep copy of the given directory object. If `copyFiles` is true, then
      // file contents are copied too, otherwise they are just linked.
      return kj::atomicRefcounted<InMemoryDirectory>(clock, fileFactory, other, copyFiles);
    }